

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::zbranch(Forth *this)

{
  uint uVar1;
  
  requireDStackDepth(this,1,"(ZBRANCH)");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if (uVar1 == this->False) {
    branch(this);
    return;
  }
  this->next_command = this->next_command + 4;
  return;
}

Assistant:

void zbranch() {
			REQUIRE_DSTACK_DEPTH(1, "(ZBRANCH)");
			auto flag = dStack.getTop(); pop();
			if (flag == False)
				branch();
			else
				next_command += sizeof(next_command); 
		}